

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O0

char * get_yanglint_dir(void)

{
  __uid_t __uid;
  int iVar1;
  passwd *ppVar2;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  char *yl_dir;
  char *user_home;
  passwd *pw;
  char *pcStack_10;
  int ret;
  
  __uid = getuid();
  ppVar2 = getpwuid(__uid);
  if (ppVar2 == (passwd *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    yl_log('\x01',"Determining home directory failed (%s).",pcVar4);
    pcStack_10 = (char *)0x0;
  }
  else {
    pcVar4 = ppVar2->pw_dir;
    sVar5 = strlen(pcVar4);
    pcStack_10 = (char *)malloc(sVar5 + 0xb);
    if (pcStack_10 == (char *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      yl_log('\x01',"Memory allocation failed (%s).",pcVar4);
      pcStack_10 = (char *)0x0;
    }
    else {
      sprintf(pcStack_10,"%s/%s",pcVar4,".yanglint");
      iVar1 = access(pcStack_10,5);
      if (iVar1 == -1) {
        piVar3 = __errno_location();
        if (*piVar3 == 2) {
          yl_log('\0',"Configuration directory \"%s\" does not exist, creating it.",pcStack_10);
          iVar1 = mkdir(pcStack_10,0x1c0);
          if ((iVar1 != 0) && (piVar3 = __errno_location(), *piVar3 != 0x11)) {
            piVar3 = __errno_location();
            pcVar4 = strerror(*piVar3);
            yl_log('\x01',"Configuration directory \"%s\" cannot be created (%s).",pcStack_10,pcVar4
                  );
            free(pcStack_10);
            pcStack_10 = (char *)0x0;
          }
        }
        else {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          yl_log('\x01',"Configuration directory \"%s\" exists but cannot be accessed (%s).",
                 pcStack_10,pcVar4);
          free(pcStack_10);
          pcStack_10 = (char *)0x0;
        }
      }
    }
  }
  return pcStack_10;
}

Assistant:

char *
get_yanglint_dir(void)
{
    int ret;
    struct passwd *pw;
    char *user_home, *yl_dir;

    if (!(pw = getpwuid(getuid()))) {
        YLMSG_E("Determining home directory failed (%s).", strerror(errno));
        return NULL;
    }
    user_home = pw->pw_dir;

    yl_dir = malloc(strlen(user_home) + 1 + strlen(YL_DIR) + 1);
    if (!yl_dir) {
        YLMSG_E("Memory allocation failed (%s).", strerror(errno));
        return NULL;
    }
    sprintf(yl_dir, "%s/%s", user_home, YL_DIR);

    ret = access(yl_dir, R_OK | X_OK);
    if (ret == -1) {
        if (errno == ENOENT) {
            /* directory does not exist */
            YLMSG_W("Configuration directory \"%s\" does not exist, creating it.", yl_dir);
            if (mkdir(yl_dir, 00700)) {
                if (errno != EEXIST) {
                    /* parallel execution, yay */
                    YLMSG_E("Configuration directory \"%s\" cannot be created (%s).", yl_dir, strerror(errno));
                    free(yl_dir);
                    return NULL;
                }
            }
        } else {
            YLMSG_E("Configuration directory \"%s\" exists but cannot be accessed (%s).", yl_dir, strerror(errno));
            free(yl_dir);
            return NULL;
        }
    }

    return yl_dir;
}